

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapMergeSort(jx9_hashmap *pMap,ProcNodeCmp xCmp,void *pCmpData)

{
  jx9_hashmap_node *pjVar1;
  uint local_13c;
  jx9_hashmap_node *pjStack_138;
  sxu32 i;
  jx9_hashmap_node *pIn;
  jx9_hashmap_node *p;
  jx9_hashmap_node *a [32];
  void *pCmpData_local;
  ProcNodeCmp xCmp_local;
  jx9_hashmap *pMap_local;
  
  SyZero(&p,0x100);
  pjStack_138 = pMap->pFirst;
  do {
    if (pjStack_138 == (jx9_hashmap_node *)0x0) {
      pIn = p;
      for (local_13c = 1; local_13c < 0x20; local_13c = local_13c + 1) {
        pIn = HashmapNodeMerge(pIn,a[(ulong)local_13c - 1],xCmp,pCmpData);
      }
      pIn->pNext = (jx9_hashmap_node *)0x0;
      pMap->pFirst = pIn;
      pMap->pCur = pMap->pFirst;
      return 0;
    }
    pIn = pjStack_138;
    pjVar1 = pjStack_138->pPrev;
    pjStack_138->pPrev = (jx9_hashmap_node *)0x0;
    for (local_13c = 0; local_13c < 0x1f; local_13c = local_13c + 1) {
      if (a[(ulong)local_13c - 1] == (jx9_hashmap_node *)0x0) {
        a[(ulong)local_13c - 1] = pIn;
        break;
      }
      pIn = HashmapNodeMerge(a[(ulong)local_13c - 1],pIn,xCmp,pCmpData);
      a[(ulong)local_13c - 1] = (jx9_hashmap_node *)0x0;
    }
    pjStack_138 = pjVar1;
    if (local_13c == 0x1f) {
      a[0x1e] = HashmapNodeMerge(a[0x1e],pIn,xCmp,pCmpData);
    }
  } while( true );
}

Assistant:

static sxi32 HashmapMergeSort(jx9_hashmap *pMap, ProcNodeCmp xCmp, void *pCmpData)
{
	jx9_hashmap_node *a[N_SORT_BUCKET], *p, *pIn;
	sxu32 i;
	SyZero(a, sizeof(a));
	/* Point to the first inserted entry */
	pIn = pMap->pFirst;
	while( pIn ){
		p = pIn;
		pIn = p->pPrev;
		p->pPrev = 0;
		for(i=0; i<N_SORT_BUCKET-1; i++){
			if( a[i]==0 ){
				a[i] = p;
				break;
			}else{
				p = HashmapNodeMerge(a[i], p, xCmp, pCmpData);
				a[i] = 0;
			}
		}
		if( i==N_SORT_BUCKET-1 ){
			/* To get here, there need to be 2^(N_SORT_BUCKET) elements in he input list.
			 * But that is impossible.
			 */
			a[i] = HashmapNodeMerge(a[i], p, xCmp, pCmpData);
		}
	}
	p = a[0];
	for(i=1; i<N_SORT_BUCKET; i++){
		p = HashmapNodeMerge(p, a[i], xCmp, pCmpData);
	}
	p->pNext = 0;
	/* Reflect the change */
	pMap->pFirst = p;
	/* Reset the loop cursor */
	pMap->pCur = pMap->pFirst;
	return SXRET_OK;
}